

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O1

void after_write(uv_write_t *req,int status)

{
  int iVar1;
  ulong uVar2;
  
  if (status == 0) {
    free(req);
    after_write_cb_called = after_write_cb_called + 1;
    return;
  }
  uVar2 = (ulong)(uint)status;
  after_write_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(uVar2,0);
  return;
}

Assistant:

static void after_write(uv_write_t* req, int status) {
  if (status) {
    fprintf(stderr, "uv_write error: %s\n", uv_strerror(status));
    ASSERT(0);
  }

  /* Free the read/write buffer and the request */
  free(req);

  after_write_cb_called++;
}